

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

int block_cmp(void *va,void *vb)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*vb <= *va) {
    uVar1 = (uint)(*vb < *va);
  }
  return uVar1;
}

Assistant:

static int block_cmp(const void *va, const void *vb) {
	const struct envy_bios_block *a = va;
	const struct envy_bios_block *b = vb;
	if (a->start < b->start)
		return -1;
	if (a->start > b->start)
		return 1;
	return 0;
}